

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O3

int __thiscall HDual::util_getBasisInvRow(HDual *this,int r,double *coef,int *inds,int *ninds)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  int iVar4;
  long lVar5;
  
  HVector::clear(&this->row_ep);
  (this->row_ep).count = 1;
  *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = r;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[r] = 1.0;
  (this->row_ep).packFlag = true;
  HFactor::btran(this->factor,&this->row_ep,this->row_epDensity);
  iVar4 = this->numRow;
  if (0 < (long)iVar4) {
    pdVar2 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      coef[lVar5] = pdVar2[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar4 != lVar5);
  }
  iVar1 = (this->row_ep).count;
  if (iVar4 < iVar1 || iVar1 < 0) {
    printf("util_getBasisInvRow: row_ep.count < 0 or row_ep.count > numRow: %4d; %4d\n");
    iVar4 = -1;
  }
  else if (iVar1 == 0) {
    iVar4 = 0;
  }
  else {
    piVar3 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      inds[lVar5] = piVar3[lVar5];
      lVar5 = lVar5 + 1;
      iVar4 = (this->row_ep).count;
    } while (lVar5 < iVar4);
  }
  *ninds = iVar4;
  std::ostream::flush();
  return 0;
}

Assistant:

int  HDual::util_getBasisInvRow(int r, double* coef, int* inds, int* ninds) {
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = r;
  row_ep.array[r] = 1;
  row_ep.packFlag = true;
  factor->btran(row_ep, row_epDensity);
  //  printf("util_getBasisInvRow: nnz = %4d/%4d\n", row_ep.count, numRow);
  for (int row=0; row<numRow; row++) {
    //    printf("BasisInvRow(%4d) = %11g\n", row,  row_ep.array[row]);
    coef[row] = row_ep.array[row];
  }
  if (0 <= row_ep.count && row_ep.count <= numRow) {
    for (int ix=0; ix<row_ep.count; ix++) inds[ix] = row_ep.index[ix];
    ninds[0] = row_ep.count;
  } else {
    printf("util_getBasisInvRow: row_ep.count < 0 or row_ep.count > numRow: %4d; %4d\n", row_ep.count, numRow);
    ninds[0] = -1;
  }
  cout << flush;
  return 0;
}